

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

void __thiscall ki::dml::Record::add_field(Record *this,FieldBase *field)

{
  string local_60;
  FieldBase *local_40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>
  local_38;
  
  local_40 = field;
  std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::push_back
            (&this->m_fields,&local_40);
  FieldBase::get_name_abi_cxx11_(&local_60,local_40);
  local_38.first._M_string_length = local_60._M_string_length;
  local_38.first._M_dataplus._M_p = (pointer)&local_38.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    local_38.first.field_2._8_8_ = local_60.field_2._8_8_;
  }
  else {
    local_38.first._M_dataplus._M_p = local_60._M_dataplus._M_p;
  }
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_38.second = local_40;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>>
              *)&this->m_field_map,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void Record::add_field(FieldBase* field)
	{
		m_fields.push_back(field);
		m_field_map.insert({ field->get_name(), field });
	}